

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::SignalEventControl::fromSyntax
          (Compilation *compilation,BinaryPropertyExprSyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *__addr;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SyntaxNode *in_RDX;
  ASTContext *in_stack_00000028;
  Expression *in_stack_00000030;
  Expression *in_stack_00000038;
  EdgeKind in_stack_00000044;
  Compilation *in_stack_00000048;
  SourceRange in_stack_00000060;
  Expression *iffCond;
  Expression *expr;
  ExpressionSyntax *right;
  ExpressionSyntax *left;
  TimingControl *in_stack_ffffffffffffff28;
  Compilation *in_stack_ffffffffffffff30;
  ASTFlags in_stack_ffffffffffffff38;
  PropertyExprSyntax *in_stack_ffffffffffffff58;
  ASTContext *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  DiagCode code;
  bitmask<slang::ast::ASTFlags> local_60;
  undefined8 local_58;
  underlying_type local_50;
  undefined8 local_48;
  undefined4 local_3c;
  ExpressionSyntax *local_38;
  undefined4 local_2c;
  ExpressionSyntax *local_28;
  SyntaxNode *local_20;
  TimingControl *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff68 >> 0x20,0);
  local_20 = in_RDX;
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x6a687f);
  local_2c = 0x280008;
  local_28 = ASTContext::requireSimpleExpr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,code)
  ;
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x6a68c6);
  local_3c = 0x280008;
  local_38 = ASTContext::requireSimpleExpr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,code)
  ;
  __addr = local_20;
  pEVar1 = local_28;
  if ((local_28 == (ExpressionSyntax *)0x0) || (local_38 == (ExpressionSyntax *)0x0)) {
    local_8 = TimingControl::badCtrl(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    local_50 = (underlying_type)
               ast::operator|(in_stack_ffffffffffffff38,(ASTFlags)in_stack_ffffffffffffff30);
    iVar2 = Expression::bind((int)pEVar1,(sockaddr *)__addr,(socklen_t)local_50);
    pEVar1 = local_38;
    local_48 = CONCAT44(extraout_var,iVar2);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,EventExpression);
    iVar2 = Expression::bind((int)pEVar1,(sockaddr *)local_20,(socklen_t)local_60.m_bits);
    local_58 = CONCAT44(extraout_var_00,iVar2);
    slang::syntax::SyntaxNode::sourceRange(in_RDX);
    local_8 = fromExpr(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030,
                       in_stack_00000028,in_stack_00000060);
  }
  return local_8;
}

Assistant:

TimingControl& SignalEventControl::fromSyntax(Compilation& compilation,
                                              const BinaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    // We can hit this case for 'iff' binary property expressions that are actually
    // just a signal event with an 'iff' clause.
    SLANG_ASSERT(syntax.kind == SyntaxKind::IffPropertyExpr);

    auto left = context.requireSimpleExpr(*syntax.left, diag::InvalidSyntaxInEventExpr);
    auto right = context.requireSimpleExpr(*syntax.right, diag::InvalidSyntaxInEventExpr);
    if (!left || !right)
        return badCtrl(compilation, nullptr);

    auto& expr = Expression::bind(*left, context,
                                  ASTFlags::EventExpression | ASTFlags::AllowClockingBlock);

    auto& iffCond = Expression::bind(*right, context, ASTFlags::EventExpression);

    return fromExpr(compilation, EdgeKind::None, expr, &iffCond, context, syntax.sourceRange());
}